

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ModelDescription::InternalSwap
          (ModelDescription *this,ModelDescription *other)

{
  int iVar1;
  string *psVar2;
  Metadata *pMVar3;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->input_).super_RepeatedPtrFieldBase,&(other->input_).super_RepeatedPtrFieldBase)
  ;
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->output_).super_RepeatedPtrFieldBase,
             &(other->output_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->traininginput_).super_RepeatedPtrFieldBase,
             &(other->traininginput_).super_RepeatedPtrFieldBase);
  psVar2 = (this->predictedfeaturename_).ptr_;
  (this->predictedfeaturename_).ptr_ = (other->predictedfeaturename_).ptr_;
  (other->predictedfeaturename_).ptr_ = psVar2;
  psVar2 = (this->predictedprobabilitiesname_).ptr_;
  (this->predictedprobabilitiesname_).ptr_ = (other->predictedprobabilitiesname_).ptr_;
  (other->predictedprobabilitiesname_).ptr_ = psVar2;
  pMVar3 = this->metadata_;
  this->metadata_ = other->metadata_;
  other->metadata_ = pMVar3;
  iVar1 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar1;
  return;
}

Assistant:

void ModelDescription::InternalSwap(ModelDescription* other) {
  input_.InternalSwap(&other->input_);
  output_.InternalSwap(&other->output_);
  traininginput_.InternalSwap(&other->traininginput_);
  predictedfeaturename_.Swap(&other->predictedfeaturename_);
  predictedprobabilitiesname_.Swap(&other->predictedprobabilitiesname_);
  std::swap(metadata_, other->metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}